

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_d_vector.h
# Opt level: O0

void __thiscall
draco::PointDVector<unsigned_int>::PointDVector
          (PointDVector<unsigned_int> *this,uint32_t n_items,uint32_t dimensionality)

{
  uint *puVar1;
  int in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  allocator_type local_11 [17];
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_EDX << 2;
  __a = local_11;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x225489);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2254a9);
  puVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2254b6);
  *(uint **)(in_RDI + 10) = puVar1;
  return;
}

Assistant:

PointDVector(const uint32_t n_items, const uint32_t dimensionality)
      : n_items_(n_items),
        dimensionality_(dimensionality),
        item_size_bytes_(dimensionality * sizeof(internal_t)),
        data_(n_items * dimensionality),
        data0_(data_.data()) {}